

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void mcadd(parse *p,cset *cs,char *cp)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t oldend;
  char *cp_local;
  cset *cs_local;
  parse *p_local;
  
  sVar1 = cs->smultis;
  sVar2 = strlen(cp);
  cs->smultis = sVar2 + 1 + cs->smultis;
  if (cs->multis == (char *)0x0) {
    pcVar3 = (char *)malloc(cs->smultis);
    cs->multis = pcVar3;
  }
  else {
    pcVar3 = (char *)realloc(cs->multis,cs->smultis);
    cs->multis = pcVar3;
  }
  if (cs->multis == (char *)0x0) {
    seterr(p,0xc);
  }
  else {
    strcpy(cs->multis + (sVar1 - 1),cp);
    cs->multis[cs->smultis - 1] = '\0';
  }
  return;
}

Assistant:

static void
mcadd(p, cs, cp)
struct parse *p;
cset *cs;
char *cp;
{
	size_t oldend = cs->smultis;

	cs->smultis += strlen(cp) + 1;
	if (cs->multis == NULL)
		cs->multis = malloc(cs->smultis);
	else
		cs->multis = realloc(cs->multis, cs->smultis);
	if (cs->multis == NULL) {
		seterr(p, REG_ESPACE);
		return;
	}

	(void) strcpy(cs->multis + oldend - 1, cp);
	cs->multis[cs->smultis - 1] = '\0';
}